

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O0

size_t __thiscall soul::AST::ModuleBase::countEndpoints(ModuleBase *this,bool countInputs)

{
  int iVar1;
  undefined4 extraout_var;
  pool_ref<soul::AST::EndpointDeclaration> *ppVar2;
  EndpointDeclaration *pEVar3;
  pool_ref<soul::AST::EndpointDeclaration> *e;
  pool_ref<soul::AST::EndpointDeclaration> *__end2;
  pool_ref<soul::AST::EndpointDeclaration> *__begin2;
  ArrayView<soul::pool_ref<soul::AST::EndpointDeclaration>_> *local_28;
  ArrayView<soul::pool_ref<soul::AST::EndpointDeclaration>_> *__range2;
  size_t num;
  ModuleBase *pMStack_10;
  bool countInputs_local;
  ModuleBase *this_local;
  
  __range2 = (ArrayView<soul::pool_ref<soul::AST::EndpointDeclaration>_> *)0x0;
  num._7_1_ = countInputs;
  pMStack_10 = this;
  iVar1 = (*(this->super_ASTObject)._vptr_ASTObject[8])();
  __begin2 = (pool_ref<soul::AST::EndpointDeclaration> *)CONCAT44(extraout_var,iVar1);
  local_28 = (ArrayView<soul::pool_ref<soul::AST::EndpointDeclaration>_> *)&__begin2;
  __end2 = ArrayView<soul::pool_ref<soul::AST::EndpointDeclaration>_>::begin(local_28);
  ppVar2 = ArrayView<soul::pool_ref<soul::AST::EndpointDeclaration>_>::end(local_28);
  for (; __end2 != ppVar2; __end2 = __end2 + 1) {
    pEVar3 = pool_ref<soul::AST::EndpointDeclaration>::operator->(__end2);
    if ((pEVar3->isInput & 1U) == (num._7_1_ & 1)) {
      __range2 = (ArrayView<soul::pool_ref<soul::AST::EndpointDeclaration>_> *)
                 ((long)&__range2->s + 1);
    }
  }
  return (size_t)__range2;
}

Assistant:

size_t countEndpoints (bool countInputs) const
        {
            size_t num = 0;

            for (auto& e : getEndpoints())
                if (e->isInput == countInputs)
                    ++num;

            return num;
        }